

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<136UL,_GF2::MOGrevlex<136UL>_> * __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *poly1,
          MP<136UL,_GF2::MOGrevlex<136UL>_> *poly2)

{
  size_t *psVar1;
  size_t pos_1;
  _List_node_base *p_Var2;
  size_t pos;
  long lVar3;
  _List_node_base *p_Var4;
  MM<136UL> m;
  MM<136UL> lm;
  _List_node_base *local_58 [2];
  ulong local_48 [5];
  
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[4] = 0;
  local_48[0] = 0;
  local_58[0] = (_List_node_base *)0x0;
  local_58[1] = (_List_node_base *)0x0;
  std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::clear
            (&this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>);
  p_Var4 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var2 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  lVar3 = 2;
  do {
    local_48[lVar3] =
         *(ulong *)((long)&p_Var2->_M_next + lVar3 * 8) |
         *(ulong *)((long)&p_Var4->_M_next + lVar3 * 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    local_48[lVar3 + 2] = local_48[lVar3 + 2] & ~*(ulong *)((long)(p_Var4 + 1) + lVar3 * 8U);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  for (p_Var4 = p_Var4->_M_next; p_Var4 != (_List_node_base *)poly1;
      p_Var4 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var4->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next) {
    local_48[0] = (ulong)(((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                          &p_Var4[2]._M_next)->
                         super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl
                         ._M_node.super__List_node_base._M_next;
    local_58[0] = *(_List_node_base **)
                   &((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)(p_Var4 + 1))->
                    super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>;
    local_58[1] = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
    lVar3 = 0;
    do {
      local_58[lVar3] = (_List_node_base *)((ulong)local_58[lVar3] | local_48[lVar3 + 2]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    p_Var2 = (_List_node_base *)operator_new(0x28);
    p_Var2[1]._M_next = local_58[0];
    p_Var2[1]._M_prev = local_58[1];
    p_Var2[2]._M_next = (_List_node_base *)local_48[0];
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var4 = (poly2->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var2 = (poly1->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  lVar3 = 2;
  do {
    local_48[lVar3] =
         *(ulong *)((long)&p_Var4->_M_next + lVar3 * 8) |
         *(ulong *)((long)&p_Var2->_M_next + lVar3 * 8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  lVar3 = 0;
  do {
    local_48[lVar3 + 2] = local_48[lVar3 + 2] & ~*(ulong *)((long)(p_Var4 + 1) + lVar3 * 8U);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  for (p_Var4 = p_Var4->_M_next; p_Var4 != (_List_node_base *)poly2;
      p_Var4 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var4->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next) {
    local_48[0] = (ulong)(((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                          &p_Var4[2]._M_next)->
                         super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl
                         ._M_node.super__List_node_base._M_next;
    local_58[0] = *(_List_node_base **)
                   &((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)(p_Var4 + 1))->
                    super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>;
    local_58[1] = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
    lVar3 = 0;
    do {
      local_58[lVar3] = (_List_node_base *)((ulong)local_58[lVar3] | local_48[lVar3 + 2]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    p_Var2 = (_List_node_base *)operator_new(0x28);
    p_Var2[1]._M_next = local_58[0];
    p_Var2[1]._M_prev = local_58[1];
    p_Var2[2]._M_next = (_List_node_base *)local_48[0];
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
              super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 + 1;
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}